

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

void armci_stride_info_init
               (stride_info_t *sinfo,void *base_ptr,int stride_levels,int *stride_arr,int *seg_count
               )

{
  int *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int *in_R8;
  int i;
  int local_2c;
  
  if (in_RDI == (undefined8 *)0x0) {
    __assert_fail("sinfo!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x21,
                  "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                 );
  }
  if (in_EDX < 0) {
    __assert_fail("stride_levels>=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x22,
                  "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                 );
  }
  if (8 < in_EDX) {
    __assert_fail("stride_levels<=ARMCI_MAX_STRIDE_LEVEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x23,
                  "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                 );
  }
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    if (local_2c == 0) {
      if (*in_RCX < *in_R8) {
        __assert_fail("stride_arr[0] >= seg_count[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                      ,0x26,
                      "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                     );
      }
    }
    else if (in_RCX[local_2c] < in_RCX[local_2c + -1] * in_R8[local_2c]) {
      __assert_fail("stride_arr[i] >= stride_arr[i-1]*seg_count[i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                    ,0x28,
                    "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                   );
    }
  }
  *in_RDI = in_RSI;
  *(int *)(in_RDI + 1) = in_EDX;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    *(int *)((long)in_RDI + (long)local_2c * 4 + 0xc) = in_RCX[local_2c];
  }
  for (local_2c = 0; local_2c < in_EDX + 1; local_2c = local_2c + 1) {
    *(int *)((long)in_RDI + (long)local_2c * 4 + 0x2c) = in_R8[local_2c];
  }
  *(undefined4 *)(in_RDI + 10) = 1;
  for (local_2c = 1; local_2c < in_EDX + 1; local_2c = local_2c + 1) {
    *(int *)(in_RDI + 10) =
         *(int *)((long)in_RDI + (long)local_2c * 4 + 0x2c) * *(int *)(in_RDI + 10);
  }
  if (*(int *)(in_RDI + 10) < 1) {
    __assert_fail("sinfo->size>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x37,
                  "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                 );
  }
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  for (local_2c = 0; local_2c < in_EDX + 1; local_2c = local_2c + 1) {
    *(undefined4 *)((long)in_RDI + (long)local_2c * 4 + 0x58) = 0;
  }
  return;
}

Assistant:

void armci_stride_info_init(stride_info_t *sinfo,
			    void *base_ptr,
			    int stride_levels,
			    const int *stride_arr,
			    const int *seg_count) {
  int i;
  assert(sinfo!=NULL);
  assert(stride_levels>=0);
  assert(stride_levels<=ARMCI_MAX_STRIDE_LEVEL);
  for(i=0; i<stride_levels; i++) {
    if(i==0) 
      assert(stride_arr[0] >= seg_count[0]);
    else 
      assert(stride_arr[i] >= stride_arr[i-1]*seg_count[i]);
  }

  sinfo->base_ptr= base_ptr;
  sinfo->stride_levels = stride_levels;
  for(i=0; i<stride_levels; i++) {
    sinfo->stride_arr[i] = stride_arr[i];
  }
  for(i=0; i<stride_levels+1; i++) {
    sinfo->seg_count[i] = seg_count[i];
  }
  sinfo->size=1;
  for(i=1; i<stride_levels+1; i++) {
    sinfo->size *= sinfo->seg_count[i];
  }
  assert(sinfo->size>0);
  sinfo->pos=0;
  for(i=0; i<stride_levels+1; i++) {
    sinfo->itr[i] = 0;
  }
}